

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall llvm::yaml::Output::endMapping(Output *this)

{
  reference pIVar1;
  StringRef local_30;
  StringRef local_20;
  Output *local_10;
  Output *this_local;
  
  local_10 = this;
  pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                     ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                      &this->StateStack);
  if (*pIVar1 == inMapFirstKey) {
    (this->Padding).Data = (this->PaddingBeforeContainer).Data;
    (this->Padding).Length = (this->PaddingBeforeContainer).Length;
    newLineCheck(this);
    StringRef::StringRef(&local_20,"{}");
    output(this,local_20);
    StringRef::StringRef(&local_30,"\n");
    (this->Padding).Data = local_30.Data;
    (this->Padding).Length = local_30.Length;
  }
  SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::pop_back
            ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)&this->StateStack);
  return;
}

Assistant:

void Output::endMapping() {
  // If we did not map anything, we should explicitly emit an empty map
  if (StateStack.back() == inMapFirstKey) {
    Padding = PaddingBeforeContainer;
    newLineCheck();
    output("{}");
    Padding = "\n";
  }
  StateStack.pop_back();
}